

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O1

void __thiscall
QTextDocumentLayoutPrivate::drawBorder
          (QTextDocumentLayoutPrivate *this,QPainter *painter,QRectF *rect,qreal topMargin,
          qreal bottomMargin,qreal border,QBrush *brush,BorderStyle style)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  RenderHints RVar4;
  long lVar5;
  BorderStyle style_00;
  qreal *pqVar6;
  BorderPaginator *pBVar7;
  int page;
  long in_FS_OFFSET;
  double dVar8;
  QSizeF QVar9;
  BorderPaginator paginator;
  undefined1 local_c8 [8];
  undefined1 local_c0 [8];
  undefined1 local_b8 [8];
  undefined1 local_b0 [8];
  QRectF local_a8;
  BorderPaginator local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pqVar6 = (qreal *)&DAT_006bc718;
  pBVar7 = &local_80;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    pBVar7->pageHeight = *pqVar6;
    pqVar6 = pqVar6 + 1;
    pBVar7 = (BorderPaginator *)&pBVar7->topPage;
  }
  QVar9 = QTextDocument::pageSize((this->super_QAbstractTextDocumentLayoutPrivate).document);
  local_80.pageHeight = QVar9.ht;
  local_80.bottomPage = 0;
  local_80.topPage = (int)(rect->yp / local_80.pageHeight);
  if (local_80.pageHeight <= 0.0) {
    local_80.topPage = 0;
  }
  else {
    local_80.bottomPage = (int)((rect->yp + rect->h + border) / local_80.pageHeight);
  }
  local_80.rect.xp = rect->xp;
  local_80.rect.yp = rect->yp;
  local_80.rect.w = rect->w;
  local_80.rect.h = rect->h;
  local_80.topMarginAfterPageBreak = topMargin;
  local_80.bottomMargin = bottomMargin;
  local_80.border = border;
  RVar4 = QPainter::renderHints(painter);
  QPainter::setRenderHint(painter,Antialiasing,true);
  if (local_80.topPage <= local_80.bottomPage) {
    style_00 = style + BorderStyle_Dotted;
    page = local_80.topPage;
    do {
      local_a8.w._0_4_ = 0xffffffff;
      local_a8.w._4_4_ = 0xffffffff;
      local_a8.h._0_4_ = 0xffffffff;
      local_a8.h._4_4_ = 0xffffffff;
      local_a8.xp._0_4_ = 0xffffffff;
      local_a8.xp._4_4_ = 0xffffffff;
      local_a8.yp._0_4_ = 0xffffffff;
      local_a8.yp._4_4_ = 0xffffffff;
      BorderPaginator::clipRect(&local_a8,&local_80,page);
      if ((0.0 < (double)CONCAT44(local_a8.w._4_4_,local_a8.w._0_4_)) &&
         (dVar3 = (double)CONCAT44(local_a8.h._4_4_,local_a8.h._0_4_), 0.0 < dVar3)) {
        dVar2 = (double)CONCAT44(local_a8.xp._4_4_,local_a8.xp._0_4_);
        dVar8 = (double)CONCAT44(local_a8.yp._4_4_,local_a8.yp._0_4_);
        QBrush::QBrush((QBrush *)local_b0,brush);
        qDrawEdge(painter,dVar2,dVar8,dVar2 + border,dVar3 + dVar8 + border,0.0,0.0,LeftEdge,
                  style_00,(QBrush)local_b0);
        QBrush::~QBrush((QBrush *)local_b0);
        dVar3 = (double)CONCAT44(local_a8.xp._4_4_,local_a8.xp._0_4_);
        dVar2 = (double)CONCAT44(local_a8.yp._4_4_,local_a8.yp._0_4_);
        dVar8 = (double)CONCAT44(local_a8.w._4_4_,local_a8.w._0_4_);
        QBrush::QBrush((QBrush *)local_b8,brush);
        qDrawEdge(painter,dVar3 + border,dVar2,dVar3 + dVar8 + border,dVar2 + border,0.0,0.0,TopEdge
                  ,style_00,(QBrush)local_b8);
        QBrush::~QBrush((QBrush *)local_b8);
        dVar3 = (double)CONCAT44(local_a8.yp._4_4_,local_a8.yp._0_4_);
        dVar8 = (double)CONCAT44(local_a8.xp._4_4_,local_a8.xp._0_4_) +
                (double)CONCAT44(local_a8.w._4_4_,local_a8.w._0_4_);
        dVar2 = (double)CONCAT44(local_a8.h._4_4_,local_a8.h._0_4_);
        QBrush::QBrush((QBrush *)local_c0,brush);
        qDrawEdge(painter,dVar8,dVar3 + border,dVar8 + border,dVar3 + dVar2,0.0,0.0,RightEdge,
                  style_00,(QBrush)local_c0);
        QBrush::~QBrush((QBrush *)local_c0);
        dVar3 = (double)CONCAT44(local_a8.xp._4_4_,local_a8.xp._0_4_);
        dVar8 = (double)CONCAT44(local_a8.yp._4_4_,local_a8.yp._0_4_) +
                (double)CONCAT44(local_a8.h._4_4_,local_a8.h._0_4_);
        dVar2 = (double)CONCAT44(local_a8.w._4_4_,local_a8.w._0_4_);
        QBrush::QBrush((QBrush *)local_c8,brush);
        qDrawEdge(painter,dVar3 + border,dVar8,dVar3 + dVar2 + border,dVar8 + border,0.0,0.0,
                  BottomEdge,style_00,(QBrush)local_c8);
        QBrush::~QBrush((QBrush *)local_c8);
      }
      bVar1 = page < local_80.bottomPage;
      page = page + 1;
    } while (bVar1);
  }
  if (((uint)RVar4.super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
             super_QFlagsStorage<QPainter::RenderHint>.i & 1) == 0) {
    QPainter::setRenderHint(painter,Antialiasing,false);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::drawBorder(QPainter *painter, const QRectF &rect, qreal topMargin, qreal bottomMargin,
                                            qreal border, const QBrush &brush, QTextFrameFormat::BorderStyle style) const
{
    BorderPaginator paginator(document, rect, topMargin, bottomMargin, border);

#ifndef QT_NO_CSSPARSER
    QCss::BorderStyle cssStyle = static_cast<QCss::BorderStyle>(style + 1);
#else
    Q_UNUSED(style);
#endif //QT_NO_CSSPARSER

    bool turn_off_antialiasing = !(painter->renderHints() & QPainter::Antialiasing);
    painter->setRenderHint(QPainter::Antialiasing);

    for (int i = paginator.topPage; i <= paginator.bottomPage; ++i) {
        QRectF clipped = paginator.clipRect(i);
        if (!clipped.isValid())
            continue;

#ifndef QT_NO_CSSPARSER
        qDrawEdge(painter, clipped.left(), clipped.top(), clipped.left() + border, clipped.bottom() + border, 0, 0, QCss::LeftEdge, cssStyle, brush);
        qDrawEdge(painter, clipped.left() + border, clipped.top(), clipped.right() + border, clipped.top() + border, 0, 0, QCss::TopEdge, cssStyle, brush);
        qDrawEdge(painter, clipped.right(), clipped.top() + border, clipped.right() + border, clipped.bottom(), 0, 0, QCss::RightEdge, cssStyle, brush);
        qDrawEdge(painter, clipped.left() + border, clipped.bottom(), clipped.right() + border, clipped.bottom() + border, 0, 0, QCss::BottomEdge, cssStyle, brush);
#else
        painter->save();
        painter->setPen(Qt::NoPen);
        painter->setBrush(brush);
        painter->drawRect(QRectF(clipped.left(), clipped.top(), clipped.left() + border, clipped.bottom() + border));
        painter->drawRect(QRectF(clipped.left() + border, clipped.top(), clipped.right() + border, clipped.top() + border));
        painter->drawRect(QRectF(clipped.right(), clipped.top() + border, clipped.right() + border, clipped.bottom()));
        painter->drawRect(QRectF(clipped.left() + border, clipped.bottom(), clipped.right() + border, clipped.bottom() + border));
        painter->restore();
#endif //QT_NO_CSSPARSER
    }
    if (turn_off_antialiasing)
        painter->setRenderHint(QPainter::Antialiasing, false);
}